

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

char english_letter_sample(int *seed)

{
  int i;
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar4 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar4;
  iVar1 = iVar1 + iVar4 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  lVar3 = 1;
  do {
    if ((double)iVar1 * 4.656612875e-10 <= english_letter_cdf::cdf_vec[lVar3]) {
      return (char)lVar3 + '`';
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1b);
  return ' ';
}

Assistant:

char english_letter_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    ENGLISH_LETTER_SAMPLE samples the English Letter PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, character C, a sample of the PDF.
//
{
  char c;
  double cdf;

  cdf = r8_uniform_01 ( seed );

  c = english_letter_cdf_inv ( cdf );

  return c;
}